

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O0

void __thiscall crnlib::qdxt5::optimize_selectors_task(qdxt5 *this,uint64 data,void *pData_ptr)

{
  uint *this_00;
  uint uVar1;
  dxt_pixel_block *pdVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint h;
  int iVar6;
  crn_thread_id_t cVar7;
  uint *puVar8;
  dxt5_block *pdVar9;
  vector<unsigned_int> *local_218;
  vector<unsigned_int> *local_128;
  dxt5_block *dst_block_1;
  uint local_110;
  uint block_index_2;
  uint block_iter_2;
  int error;
  uint values [8];
  dxt5_block *dst_block;
  color_quad_u8 *orig_color;
  uint block_index_1;
  uint block_iter_1;
  uint64 total_error;
  ulong uStack_b8;
  uint s;
  uint64 best_error;
  uint local_a8;
  uint best_s;
  uint x;
  uint y;
  vector<unsigned_int> *block_indices;
  uint uStack_8e;
  uint block_type;
  dxt5_block blk;
  dxt5_block *src_block;
  uint block_index;
  uint block_iter;
  vector<unsigned_int> *selector_indices;
  uint local_68;
  uint cluster_index;
  undefined1 local_58 [8];
  vector<unsigned_int> block_categories [2];
  optimize_selectors_params *task_params;
  uint thread_index;
  void *pData_ptr_local;
  uint64 data_local;
  qdxt5 *this_local;
  
  local_128 = (vector<unsigned_int> *)local_58;
  do {
    vector<unsigned_int>::vector(local_128);
    local_128 = local_128 + 1;
  } while (local_128 != (vector<unsigned_int> *)&block_categories[1].m_size);
  vector<unsigned_int>::reserve((vector<unsigned_int> *)local_58,0x800);
  vector<unsigned_int>::reserve((vector<unsigned_int> *)&block_categories[0].m_size,0x800);
  local_68 = 0;
  do {
    uVar1 = local_68;
    uVar5 = vector<crnlib::vector<unsigned_int>_>::size(*pData_ptr);
    if (uVar5 <= uVar1) {
      selector_indices._4_4_ = 0;
LAB_0016ab0e:
      local_218 = (vector<unsigned_int> *)&block_categories[1].m_size;
      do {
        local_218 = local_218 + -1;
        vector<unsigned_int>::~vector(local_218);
      } while (local_218 != (vector<unsigned_int> *)local_58);
      return;
    }
    if ((this->m_canceled & 1U) != 0) {
      selector_indices._4_4_ = 1;
      goto LAB_0016ab0e;
    }
    if (((local_68 & 0xff) == 0) &&
       (cVar7 = crn_get_current_thread_id(), uVar1 = local_68, cVar7 == this->m_main_thread_id)) {
      uVar5 = vector<crnlib::vector<unsigned_int>_>::size(*pData_ptr);
      bVar3 = update_progress(this,uVar1,uVar5 - 1);
      if (!bVar3) {
        selector_indices._4_4_ = 1;
        goto LAB_0016ab0e;
      }
    }
    uVar5 = task_pool::get_num_threads(this->m_pTask_pool);
    uVar1 = local_68;
    if ((uVar5 == 0) ||
       (uVar5 = task_pool::get_num_threads(this->m_pTask_pool), uVar1 % (uVar5 + 1) == (uint)data))
    {
      _block_index = vector<crnlib::vector<unsigned_int>_>::operator[](*pData_ptr,local_68);
      uVar5 = vector<unsigned_int>::size(_block_index);
      if (1 < uVar5) {
        vector<unsigned_int>::resize((vector<unsigned_int> *)local_58,0,false);
        vector<unsigned_int>::resize((vector<unsigned_int> *)&block_categories[0].m_size,0,false);
        for (src_block._4_4_ = 0; uVar1 = src_block._4_4_,
            uVar5 = vector<unsigned_int>::size(_block_index), uVar1 < uVar5;
            src_block._4_4_ = src_block._4_4_ + 1) {
          puVar8 = vector<unsigned_int>::operator[](_block_index,src_block._4_4_);
          src_block._0_4_ = *puVar8;
          blk = (dxt5_block)get_block(this,(uint)src_block);
          bVar3 = dxt5_block::is_alpha6_block((dxt5_block *)blk);
          vector<unsigned_int>::push_back
                    ((vector<unsigned_int> *)&block_categories[(ulong)bVar3 - 1].m_size,
                     (uint *)&src_block);
        }
        utils::zero_object<crnlib::dxt5_block>((dxt5_block *)&stack0xffffffffffffff70);
        for (block_indices._4_4_ = 0; block_indices._4_4_ < 2;
            block_indices._4_4_ = block_indices._4_4_ + 1) {
          this_00 = &block_categories[(ulong)block_indices._4_4_ - 1].m_size;
          uVar5 = vector<unsigned_int>::size((vector<unsigned_int> *)this_00);
          if (1 < uVar5) {
            for (best_s = 0; best_s < 4; best_s = best_s + 1) {
              for (local_a8 = 0; local_a8 < 4; local_a8 = local_a8 + 1) {
                best_error._4_4_ = 0;
                uStack_b8 = 0xffffffffff;
                for (total_error._4_4_ = 0; total_error._4_4_ < 8;
                    total_error._4_4_ = total_error._4_4_ + 1) {
                  _block_index_1 = 0;
                  for (orig_color._4_4_ = 0;
                      uVar5 = vector<unsigned_int>::size((vector<unsigned_int> *)this_00),
                      orig_color._4_4_ < uVar5; orig_color._4_4_ = orig_color._4_4_ + 1) {
                    puVar8 = vector<unsigned_int>::operator[]
                                       ((vector<unsigned_int> *)this_00,orig_color._4_4_);
                    uVar1 = *puVar8;
                    pdVar2 = this->m_pBlocks;
                    pdVar9 = get_block(this,uVar1);
                    uVar5 = dxt5_block::get_low_alpha(pdVar9);
                    h = dxt5_block::get_high_alpha(pdVar9);
                    dxt5_block::get_block_values(&block_iter_2,uVar5,h);
                    bVar4 = color_quad<unsigned_char,_int>::operator[]
                                      (pdVar2[uVar1].m_pixels[best_s] + local_a8,
                                       (this->m_params).m_comp_index);
                    iVar6 = math::square<int>((uint)bVar4 - (&block_iter_2)[total_error._4_4_]);
                    _block_index_1 = (long)iVar6 + _block_index_1;
                  }
                  if (_block_index_1 < uStack_b8) {
                    uStack_b8 = _block_index_1;
                    best_error._4_4_ = total_error._4_4_;
                  }
                }
                dxt5_block::set_selector
                          ((dxt5_block *)&stack0xffffffffffffff70,local_a8,best_s,best_error._4_4_);
              }
            }
            for (local_110 = 0; uVar5 = vector<unsigned_int>::size((vector<unsigned_int> *)this_00),
                local_110 < uVar5; local_110 = local_110 + 1) {
              puVar8 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)this_00,local_110);
              pdVar9 = get_block(this,*puVar8);
              *(uint *)pdVar9->m_selectors = uStack_8e;
              *(undefined2 *)(pdVar9->m_selectors + 4) = block_type._2_2_;
            }
          }
        }
      }
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

void qdxt5::optimize_selectors_task(uint64 data, void* pData_ptr)
    {
        const uint thread_index = static_cast<uint>(data);

        optimize_selectors_params& task_params = *static_cast<optimize_selectors_params*>(pData_ptr);

        crnlib::vector<uint> block_categories[2];
        block_categories[0].reserve(2048);
        block_categories[1].reserve(2048);

        for (uint cluster_index = 0; cluster_index < task_params.m_selector_cluster_indices.size(); cluster_index++)
        {
            if (m_canceled)
            {
                return;
            }

            if ((cluster_index & 255) == 0)
            {
                if (crn_get_current_thread_id() == m_main_thread_id)
                {
                    if (!update_progress(cluster_index, task_params.m_selector_cluster_indices.size() - 1))
                    {
                        return;
                    }
                }
            }

            if (m_pTask_pool->get_num_threads())
            {
                if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const crnlib::vector<uint>& selector_indices = task_params.m_selector_cluster_indices[cluster_index];

            if (selector_indices.size() <= 1)
            {
                continue;
            }

            block_categories[0].resize(0);
            block_categories[1].resize(0);

            for (uint block_iter = 0; block_iter < selector_indices.size(); block_iter++)
            {
                const uint block_index = selector_indices[block_iter];

                const dxt5_block& src_block = get_block(block_index);

                block_categories[src_block.is_alpha6_block()].push_back(block_index);
            }

            dxt5_block blk;
            utils::zero_object(blk);

            for (uint block_type = 0; block_type <= 1; block_type++)
            {
                const crnlib::vector<uint>& block_indices = block_categories[block_type];
                if (block_indices.size() <= 1)
                {
                    continue;
                }

                for (uint y = 0; y < cDXTBlockSize; y++)
                {
                    for (uint x = 0; x < cDXTBlockSize; x++)
                    {
                        uint best_s = 0;
                        uint64 best_error = 0xFFFFFFFFFFULL;

                        for (uint s = 0; s < dxt5_block::cMaxSelectorValues; s++)
                        {
                            uint64 total_error = 0;

                            for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                            {
                                const uint block_index = block_indices[block_iter];

                                const color_quad_u8& orig_color = m_pBlocks[block_index].m_pixels[y][x];

                                const dxt5_block& dst_block = get_block(block_index);

                                uint values[dxt5_block::cMaxSelectorValues];
                                dxt5_block::get_block_values(values, dst_block.get_low_alpha(), dst_block.get_high_alpha());

                                int error = math::square((int)orig_color[m_params.m_comp_index] - (int)values[s]);

                                total_error += error;
                            }

                            if (total_error < best_error)
                            {
                                best_error = total_error;
                                best_s = s;
                            }
                        }

                        blk.set_selector(x, y, best_s);

                    } // x
                } // y

                for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                {
                    const uint block_index = block_indices[block_iter];

                    dxt5_block& dst_block = get_block(block_index);

                    memcpy(dst_block.m_selectors, blk.m_selectors, sizeof(dst_block.m_selectors));
                }
            }

        } // cluster_index
    }